

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

char * get_GLSL_uniform_array_varname(Context *ctx,RegisterType regtype,char *buf,size_t len)

{
  char *pcVar1;
  char *pcVar2;
  char *type;
  char *shadertype;
  size_t len_local;
  char *buf_local;
  RegisterType regtype_local;
  Context *ctx_local;
  
  pcVar1 = ctx->shader_type_str;
  pcVar2 = get_GLSL_uniform_type(ctx,regtype);
  snprintf(buf,len,"%s_uniforms_%s",pcVar1,pcVar2);
  return buf;
}

Assistant:

static const char *get_GLSL_uniform_array_varname(Context *ctx,
                                                  const RegisterType regtype,
                                                  char *buf, const size_t len)
{
    const char *shadertype = ctx->shader_type_str;
    const char *type = get_GLSL_uniform_type(ctx, regtype);
    snprintf(buf, len, "%s_uniforms_%s", shadertype, type);
    return buf;
}